

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

RsElseClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::RsElseClauseSyntax,slang::parsing::Token,slang::syntax::RsProdItemSyntax&>
          (BumpAllocator *this,Token *args,RsProdItemSyntax *args_1)

{
  Token keyword;
  RsElseClauseSyntax *pRVar1;
  BumpAllocator *in_RDX;
  Info *in_RSI;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  pRVar1 = (RsElseClauseSyntax *)
           allocate(in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  keyword.info = in_RSI;
  keyword._0_8_ = in_RDX;
  slang::syntax::RsElseClauseSyntax::RsElseClauseSyntax
            ((RsElseClauseSyntax *)in_RSI->location,keyword,(RsProdItemSyntax *)in_RSI->rawTextPtr);
  return pRVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }